

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

Vec_Int_t * Abc_NtkFinComputeObjects(Vec_Int_t *vPairs,Vec_Wec_t **pvMap,int nObjs)

{
  uint Entry;
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  Vec_Wec_t *pVVar3;
  Vec_Int_t *pVVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar2 = (int *)malloc(400);
  p->pArray = piVar2;
  pVVar3 = (Vec_Wec_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < nObjs - 1U) {
    iVar7 = nObjs;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar7,0x10);
  }
  pVVar3->pArray = pVVar4;
  pVVar3->nSize = nObjs;
  *pvMap = pVVar3;
  if (3 < vPairs->nSize) {
    uVar10 = 2;
    iVar7 = 3;
    do {
      Entry = vPairs->pArray[uVar10];
      Vec_IntPush(p,Entry);
      pVVar3 = *pvMap;
      if (pVVar3->nSize <= (int)Entry) {
        iVar6 = Entry + 1;
        iVar1 = pVVar3->nSize * 2;
        if (iVar1 <= iVar6) {
          iVar1 = iVar6;
        }
        if (pVVar3->nCap < iVar1) {
          sVar8 = (long)iVar1 << 4;
          if (pVVar3->pArray == (Vec_Int_t *)0x0) {
            pVVar4 = (Vec_Int_t *)malloc(sVar8);
          }
          else {
            pVVar4 = (Vec_Int_t *)realloc(pVVar3->pArray,sVar8);
          }
          pVVar3->pArray = pVVar4;
          memset(pVVar4 + pVVar3->nCap,0,((long)iVar1 - (long)pVVar3->nCap) * 0x10);
          pVVar3->nCap = iVar1;
        }
        pVVar3->nSize = iVar6;
      }
      if (((int)Entry < 0) || (pVVar3->nSize <= (int)Entry)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(pVVar3->pArray + Entry,(uint)(uVar10 >> 1) & 0x7fffffff);
      uVar10 = uVar10 + 2;
      iVar7 = iVar7 + 2;
    } while (iVar7 < vPairs->nSize);
  }
  sVar8 = (size_t)p->nSize;
  if (1 < (long)sVar8) {
    piVar2 = p->pArray;
    qsort(piVar2,sVar8,4,Vec_IntSortCompare1);
    iVar7 = 1;
    sVar5 = 1;
    do {
      if (piVar2[sVar5] != piVar2[sVar5 - 1]) {
        lVar9 = (long)iVar7;
        iVar7 = iVar7 + 1;
        piVar2[lVar9] = piVar2[sVar5];
      }
      sVar5 = sVar5 + 1;
    } while (sVar8 != sVar5);
    p->nSize = iVar7;
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkFinComputeObjects( Vec_Int_t * vPairs, Vec_Wec_t ** pvMap, int nObjs )
{
    int i, iObj, Type;
    Vec_Int_t * vObjs = Vec_IntAlloc( 100 );
    *pvMap = Vec_WecStart( nObjs );
    Vec_IntForEachEntryDoubleStart( vPairs, iObj, Type, i, 2 )
    {
        Vec_IntPush( vObjs, iObj );
        Vec_WecPush( *pvMap, iObj, i/2 );
    }
    Vec_IntUniqify( vObjs );
    return vObjs;
}